

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

int * Extra_GreyCodeSchedule(int n)

{
  int *piVar1;
  int local_24;
  int local_20;
  int b;
  int k;
  int i;
  int *pRes;
  int n_local;
  
  piVar1 = (int *)malloc((long)(1 << ((byte)n & 0x1f)) << 2);
  local_24 = 0;
  for (local_20 = 0; local_20 < n; local_20 = local_20 + 1) {
    piVar1[local_24] = local_20;
    for (b = 1; local_24 = local_24 + 1, b < 1 << ((byte)local_20 & 0x1f); b = b + 1) {
      piVar1[local_24] = piVar1[b + -1];
    }
  }
  piVar1[local_24] = n + -1;
  if (local_24 + 1 == 1 << ((byte)n & 0x1f)) {
    return piVar1;
  }
  __assert_fail("b == (1<<n)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                ,0x883,"int *Extra_GreyCodeSchedule(int)");
}

Assistant:

int * Extra_GreyCodeSchedule( int n )
{
    int * pRes = ABC_ALLOC( int, (1<<n) );
    int i, k, b = 0;
//    pRes[b++] = -1;
    for ( k = 0; k < n; k++ )
        for ( pRes[b++] = k, i = 1; i < (1<<k); i++ )
            pRes[b++] = pRes[i-1]; // pRes[i];
    pRes[b++] = n-1;
    assert( b == (1<<n) );

    if ( 0 )
    {
        unsigned uSign = 0;
        for ( b = 0; b < (1<<n); b++ )
        {
            uSign ^= (1 << pRes[b]);
            printf( "%3d %3d  ", b, pRes[b] );
            Extra_PrintBinary( stdout, &uSign, n );
            printf( "\n" );
        }
    }
    return pRes;
}